

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

void __thiscall ArgumentParser::Instance::Bind(Instance *this,bool *val)

{
  ExpectAtLeast local_40;
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
  local_38;
  bool *local_18;
  bool *val_local;
  Instance *this_local;
  
  *val = true;
  local_18 = val;
  val_local = (bool *)this;
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  function(&local_38,(nullptr_t)0x0);
  ExpectAtLeast::ExpectAtLeast(&local_40,0);
  Bind(this,&local_38,local_40);
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  ~function(&local_38);
  return;
}

Assistant:

void Instance::Bind(bool& val)
{
  val = true;
  this->Bind(nullptr, ExpectAtLeast{ 0 });
}